

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBaseClass.cpp
# Opt level: O3

void __thiscall
vkt::Draw::DrawTestsBaseClass::initPipeline(DrawTestsBaseClass *this,VkDevice device)

{
  DeviceInterface *pDVar1;
  VkPipeline obj;
  StencilOpState _front;
  StencilOpState _back;
  Handle<(vk::HandleType)18> HVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  const_iterator cVar5;
  Move<vk::Handle<(vk::HandleType)18>_> local_478;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_458;
  undefined1 local_438 [24];
  VkShaderModule VStack_420;
  VkPipelineColorBlendAttachmentState *local_418;
  VkSpecializationInfo *pVStack_410;
  pointer local_408;
  pointer local_400;
  pointer local_3f8;
  pointer local_3f0;
  pointer local_3e0;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_3c8;
  VkShaderModule local_3a8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3a0;
  VkShaderModule local_388;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_380;
  VkStencilOpState local_368;
  VkStencilOpState local_348;
  Attachment vkCbAttachmentState;
  PipelineCreateInfo pipelineCreateInfo;
  
  pDVar1 = this->m_vk;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)((this->super_TestInstance).m_context)->m_progCollection,
                 &this->m_vertexShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar1,device,
             *(ProgramBinary **)(cVar5._M_node + 2),0);
  DStack_380.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_380.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_388.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_380.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pDVar1 = this->m_vk;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)((this->super_TestInstance).m_context)->m_progCollection,
                 &this->m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar1,device,
             *(ProgramBinary **)(cVar5._M_node + 2),0);
  DStack_3a0.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_3a0.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_3a8.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_3a0.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&vkCbAttachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,
             VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf
            );
  PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,0,0);
  PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_438,local_388,"main",VK_SHADER_STAGE_VERTEX_BIT);
  PipelineCreateInfo::addShader(&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_438);
  PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_438,local_3a8,"main",VK_SHADER_STAGE_FRAGMENT_BIT);
  PipelineCreateInfo::addShader(&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_438);
  local_438._0_4_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType;
  local_438._4_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_438._8_8_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_438._16_4_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  local_438._20_4_ =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexBindingDescriptionCount;
  VStack_420.m_internal =
       (deUint64)
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_418 = *(VkPipelineColorBlendAttachmentState **)
               &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
                vertexAttributeDescriptionCount;
  pVStack_410 = (VkSpecializationInfo *)
                (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
                pVertexAttributeDescriptions;
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineVertexInputStateCreateInfo *)local_438);
  PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)local_438,this->m_topology,0);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)local_438);
  PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)local_438,1,
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  PipelineCreateInfo::addState(&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)local_438)
  ;
  if (local_400 != (pointer)0x0) {
    operator_delete(local_400,(long)local_3f0 - (long)local_400);
  }
  local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->x = 0.0;
  (local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->y = 0.0;
  (local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->width = 256.0;
  (local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->height = 256.0;
  (local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->minDepth = 0.0;
  (local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->maxDepth = 1.0;
  local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  ((local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).x = 0;
  ((local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).y = 0;
  ((local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).width = 0x100;
  ((local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).height = 0x100;
  local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_finish;
  PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)local_438,1,&local_458,&local_3c8);
  PipelineCreateInfo::addState(&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)local_438);
  if (local_3f0 != (pointer)0x0) {
    operator_delete(local_3f0,(long)local_3e0 - (long)local_3f0);
  }
  if (local_408 != (pointer)0x0) {
    operator_delete(local_408,(long)local_3f8 - (long)local_408);
  }
  if (local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_458.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_348,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_368,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_348.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_348.failOp;
  _front.super_VkStencilOpState.passOp = local_348.passOp;
  _front.super_VkStencilOpState.compareOp = local_348.compareOp;
  _front.super_VkStencilOpState.compareMask = local_348.compareMask;
  _front.super_VkStencilOpState.writeMask = local_348.writeMask;
  _front.super_VkStencilOpState.reference = local_348.reference;
  _back.super_VkStencilOpState.depthFailOp = local_368.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_368.failOp;
  _back.super_VkStencilOpState.passOp = local_368.passOp;
  _back.super_VkStencilOpState.compareOp = local_368.compareOp;
  _back.super_VkStencilOpState.compareMask = local_368.compareMask;
  _back.super_VkStencilOpState.writeMask = local_368.writeMask;
  _back.super_VkStencilOpState.reference = local_368.reference;
  PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)local_438,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)local_438);
  PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)local_438,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)local_438);
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       (deUint64)operator_new(4);
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 4);
  *(undefined4 *)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       0xffffffff;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)local_438,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_478,false,false);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)local_438);
  if (local_408 != (pointer)0x0) {
    operator_delete(local_408,(long)local_3f8 - (long)local_408);
  }
  if ((undefined4 *)
      local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (undefined4 *)0x0) {
    operator_delete((void *)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  ::vk::createGraphicsPipeline
            (&local_478,this->m_vk,device,(VkPipelineCache)0x0,
             &pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar4 = local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar3 = local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar1 = local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar2.m_internal =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_438._16_8_ =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  VStack_420.m_internal =
       (deUint64)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
  ;
  local_438._0_8_ =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_438._8_8_ =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         pVVar3;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         pVVar4;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         HVar2.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         pDVar1;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,obj
              );
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)local_438._16_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_420.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         local_438._0_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_438._8_8_;
    if (local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  if (pipelineCreateInfo.m_multisampleStateSampleMask.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_multisampleStateSampleMask.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_scissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_scissors.
                    super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_viewports.
      super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_viewports.
                    super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_dynamicStates.
      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_dynamicStates.
                    super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_colorBlendStateAttachments.
      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_colorBlendStateAttachments.
                    super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_shaders.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_shaders.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_3a0,local_3a8);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_380,local_388);
  }
  return;
}

Assistant:

void DrawTestsBaseClass::initPipeline (const vk::VkDevice device)
{
	const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
	const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

	const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

	vk::VkViewport viewport;
	viewport.x				= 0;
	viewport.y				= 0;
	viewport.width			= static_cast<float>(WIDTH);
	viewport.height			= static_cast<float>(HEIGHT);
	viewport.minDepth		= 0.0f;
	viewport.maxDepth		= 1.0f;

	vk::VkRect2D scissor;
	scissor.offset.x		= 0;
	scissor.offset.y		= 0;
	scissor.extent.width	= WIDTH;
	scissor.extent.height	= HEIGHT;

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<vk::VkViewport>(1, viewport), std::vector<vk::VkRect2D>(1, scissor)));
	pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());

	m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);
}